

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall
protozero::CopyablePtr<perfetto::protos::gen::TrackEvent_LegacyEvent>::CopyablePtr
          (CopyablePtr<perfetto::protos::gen::TrackEvent_LegacyEvent> *this,
          CopyablePtr<perfetto::protos::gen::TrackEvent_LegacyEvent> *other)

{
  TrackEvent_LegacyEvent *this_00;
  CopyablePtr<perfetto::protos::gen::TrackEvent_LegacyEvent> *other_local;
  CopyablePtr<perfetto::protos::gen::TrackEvent_LegacyEvent> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::TrackEvent_LegacyEvent,_std::default_delete<perfetto::protos::gen::TrackEvent_LegacyEvent>_>
  ::unique_ptr(&this->ptr_,&other->ptr_);
  this_00 = (TrackEvent_LegacyEvent *)operator_new(0xb8);
  perfetto::protos::gen::TrackEvent_LegacyEvent::TrackEvent_LegacyEvent(this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::TrackEvent_LegacyEvent,_std::default_delete<perfetto::protos::gen::TrackEvent_LegacyEvent>_>
  ::reset(&other->ptr_,this_00);
  return;
}

Assistant:

CopyablePtr(CopyablePtr&& other) noexcept : ptr_(std::move(other.ptr_)) {
    other.ptr_.reset(new T());
  }